

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O1

void __thiscall amrex::ForkJoin::copy_data_from_tasks(ForkJoin *this)

{
  ostringstream *this_00;
  int dcomp;
  FabArray<amrex::FArrayBox> *this_01;
  char cVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  Print local_1b8;
  
  if (this->flag_verbose == true) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"Copying data out of fork-join tasks ...\n",0x28);
    Print::~Print(&local_1b8);
  }
  p_Var2 = (this->data)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    this_00 = &local_1b8.ss;
    do {
      p_Var3 = p_Var2[5]._M_nxt;
      if (p_Var2[6]._M_nxt != p_Var3 && -1 < (long)p_Var2[6]._M_nxt - (long)p_Var3) {
        lVar6 = 0;
        do {
          if (*(int *)((long)&p_Var3[lVar6 * 10 + 1]._M_nxt + 4) - 1U < 2) {
            p_Var3 = p_Var3 + lVar6 * 10;
            this_01 = (FabArray<amrex::FArrayBox> *)p_Var3->_M_nxt;
            cVar1 = (char)this_00;
            if (*(int *)&p_Var3[1]._M_nxt == 2) {
              if (0 < (int)((ulong)((long)(this->split_bounds).
                                          super_vector<int,_std::allocator<int>_>.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(this->split_bounds).
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2) + -1) {
                lVar5 = 0;
                lVar4 = 0;
                do {
                  if (this->flag_verbose == true) {
                    local_1b8.os = OutStream();
                    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
                    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                         *(undefined8 *)
                          (local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"  Copying ",10);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)p_Var2[1]._M_nxt,(long)p_Var2[2]._M_nxt);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::operator<<(this_00,(int)lVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"] components [",0xe);
                    std::ostream::operator<<(this_00,*(int *)&p_Var3[4]._M_nxt[lVar4]._M_nxt);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::operator<<
                              (this_00,*(int *)((long)&p_Var3[4]._M_nxt[lVar4]._M_nxt + 4));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,") out from task ",0x10);
                    std::ostream::operator<<(this_00,(int)lVar4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00," (unsplit)",10);
                    std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar1);
                    std::ostream::put(cVar1);
                    std::ostream::flush();
                    Print::~Print(&local_1b8);
                  }
                  dcomp = *(int *)&p_Var3[4]._M_nxt[lVar4]._M_nxt;
                  FabArray<amrex::FArrayBox>::Redistribute
                            (this_01,(FabArray<amrex::FArrayBox> *)
                                     ((long)&(p_Var3[7]._M_nxt)->_M_nxt + lVar5),0,dcomp,
                             *(int *)((long)&p_Var3[4]._M_nxt[lVar4]._M_nxt + 4) - dcomp,
                             (IntVect *)((long)&p_Var3[2]._M_nxt + 4));
                  lVar4 = lVar4 + 1;
                  lVar5 = lVar5 + 0x180;
                } while (lVar4 < ((long)(this->split_bounds).super_vector<int,_std::allocator<int>_>
                                        .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000
                                 >> 0x20);
              }
            }
            else {
              if (this->flag_verbose == true) {
                local_1b8.os = OutStream();
                local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
                local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                     *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Copying ",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)p_Var2[1]._M_nxt,(long)p_Var2[2]._M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00," out from task ",0xf);
                std::ostream::operator<<(this_00,*(int *)&p_Var3[2]._M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," (whole)",8);
                std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                Print::~Print(&local_1b8);
              }
              FabArray<amrex::FArrayBox>::Redistribute
                        (this_01,(FabArray<amrex::FArrayBox> *)
                                 (p_Var3[7]._M_nxt + (long)*(int *)&p_Var3[2]._M_nxt * 0x30),0,0,
                         (this_01->super_FabArrayBase).n_comp,
                         (IntVect *)((long)&p_Var3[2]._M_nxt + 4));
            }
          }
          lVar6 = lVar6 + 1;
          p_Var3 = p_Var2[5]._M_nxt;
          lVar4 = ((long)p_Var2[6]._M_nxt - (long)p_Var3 >> 4) * -0x3333333333333333;
        } while (lVar4 - lVar6 != 0 && lVar6 <= lVar4);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void
ForkJoin::copy_data_from_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_from_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data out of fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            if (mff.intent == Intent::out || mff.intent == Intent::inout) {
                MultiFab &orig = *mff.orig;
                const auto &comp_split = mff.comp_split;
                const Vector<MultiFab> &forked = mff.forked;
                if (mff.strategy == Strategy::split) {
                    // gather components from across tasks
                    for (int i = 0; i < NTasks(); ++i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") out from task " << i << " (unsplit)" << std::endl;
                        }
                        int task_comp_n = comp_split[i].hi - comp_split[i].lo;
                        AMREX_ASSERT(forked[i].nComp() == task_comp_n);
                        orig.Redistribute(forked[i], 0, comp_split[i].lo, task_comp_n, mff.ngrow);
                    }
                } else { // mff.strategy == single or duplicate
                    // copy all components from owner_task
                    if (flag_verbose) {
                        amrex::Print() << "Copying " << mf_name << " out from task " << mff.owner_task << " (whole)" << std::endl;
                    }
                    AMREX_ASSERT(forked[mff.owner_task].nComp() == orig.nComp());
                    orig.Redistribute(forked[mff.owner_task], 0, 0, orig.nComp(), mff.ngrow);
                }
            }
        }
    }
}